

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_AllOf_Test::Body(iu_SyntaxTest_x_iutest_x_AllOf_Test *this)

{
  bool bVar1;
  detail *this_00;
  AssertionResult *ar;
  HasSubstrMatcher<const_char_(&)[2]> *in_stack_fffffffffffffc48;
  Fixed *this_01;
  string local_3a8;
  string local_388;
  AssertionHelper local_368;
  Fixed local_338;
  HasSubstrMatcher<const_char_(&)[2]> local_1b0;
  HasSubstrMatcher<const_char_(&)[2]> local_1a0;
  HasSubstrMatcher<const_char_(&)[2]> local_190;
  HasSubstrMatcher<const_char_(&)[2]> local_180;
  HasSubstrMatcher<const_char_(&)[2]> local_170;
  HasSubstrMatcher<const_char_(&)[2]> local_160;
  HasSubstrMatcher<const_char_(&)[2]> local_150;
  undefined1 local_140 [16];
  HasSubstrMatcher<const_char_(&)[2]> local_130 [2];
  HasSubstrMatcher<const_char_(&)[2]> local_110;
  HasSubstrMatcher<const_char_(&)[2]> local_100;
  AllOfMatcher<iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>_>
  local_f0;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_SyntaxTest_x_iutest_x_AllOf_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  iutest::matchers::HasSubstr<char[2]>((matchers *)&local_100,(char (*) [2])0x544afc);
  iutest::matchers::HasSubstr<char[2]>((matchers *)&local_110,(char (*) [2])0x54de0f);
  iutest::matchers::HasSubstr<char[2]>((matchers *)(local_140 + 0x10),(char (*) [2])0x5464fa);
  iutest::matchers::HasSubstr<char[2]>((matchers *)local_140,(char (*) [2])0x54da17);
  iutest::matchers::HasSubstr<char[2]>((matchers *)&local_150,(char (*) [2])0x5438bc);
  iutest::matchers::HasSubstr<char[2]>((matchers *)&local_160,(char (*) [2])0x54b4fb);
  iutest::matchers::HasSubstr<char[2]>((matchers *)&local_170,(char (*) [2])0x54d31d);
  iutest::matchers::HasSubstr<char[2]>((matchers *)&local_180,(char (*) [2])0x5438de);
  iutest::matchers::HasSubstr<char[2]>((matchers *)&local_190,(char (*) [2])0x54ba7f);
  iutest::matchers::HasSubstr<char[2]>((matchers *)&local_1a0,(char (*) [2])"9");
  iutest::matchers::HasSubstr<char[2]>((matchers *)&local_1b0,(char (*) [2])0x544afc);
  ar = (AssertionResult *)local_140;
  iutest::matchers::
  AllOf<iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>>
            (&local_f0,(matchers *)&local_100,&local_110,
             (HasSubstrMatcher<const_char_(&)[2]> *)(local_140 + 0x10),
             (HasSubstrMatcher<const_char_(&)[2]> *)ar,&local_150,&local_160,&local_170,&local_180,
             &local_190,&local_1a0,&local_1b0,in_stack_fffffffffffffc48);
  iutest::detail::
  AllOfMatcher<iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>>
  ::operator()((AssertionResult *)local_38,
               (AllOfMatcher<iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>,iutest::detail::HasSubstrMatcher<char_const(&)[2]>>
                *)&local_f0,(char (*) [11])"9347812650");
  iutest::detail::
  AllOfMatcher<iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>,_iutest::detail::HasSubstrMatcher<const_char_(&)[2]>_>
  ::~AllOfMatcher(&local_f0);
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher(&local_1b0);
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher(&local_1a0);
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher(&local_190);
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher(&local_180);
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher(&local_170);
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher(&local_160);
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher(&local_150);
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher
            ((HasSubstrMatcher<const_char_(&)[2]> *)local_140);
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher
            ((HasSubstrMatcher<const_char_(&)[2]> *)(local_140 + 0x10));
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher(&local_110);
  iutest::detail::HasSubstrMatcher<const_char_(&)[2]>::~HasSubstrMatcher(&local_100);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    this_01 = &local_338;
    memset(this_01,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(this_01);
    iutest::PrintToString<char[11]>(&local_3a8,(char (*) [11])"9347812650");
    this_00 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_388,this_00,
               "::iutest::AllOf( ::iutest::HasSubstr(\"0\") , ::iutest::HasSubstr(\"1\") , ::iutest::HasSubstr(\"2\") , ::iutest::HasSubstr(\"3\") , ::iutest::HasSubstr(\"4\") , ::iutest::HasSubstr(\"5\") , ::iutest::HasSubstr(\"6\") , ::iutest::HasSubstr(\"7\") , ::iutest::HasSubstr(\"8\") , ::iutest::HasSubstr(\"9\") , ::iutest::HasSubstr(\"0\") )"
               ,local_38,ar);
    iutest::AssertionHelper::AssertionHelper
              (&local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x2da,&local_388,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_368,&local_338);
    iutest::AssertionHelper::~AssertionHelper(&local_368);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    iutest::AssertionHelper::Fixed::~Fixed(&local_338);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

IUTEST(SyntaxTest, AllOf)
{
#if IUTEST_HAS_MATCHER_VARIADIC
    IUTEST_EXPECT_THAT("9347812650", ::iutest::AllOf(
          ::iutest::HasSubstr("0")
        , ::iutest::HasSubstr("1")
        , ::iutest::HasSubstr("2")
        , ::iutest::HasSubstr("3")
        , ::iutest::HasSubstr("4")
        , ::iutest::HasSubstr("5")
        , ::iutest::HasSubstr("6")
        , ::iutest::HasSubstr("7")
        , ::iutest::HasSubstr("8")
        , ::iutest::HasSubstr("9")
        , ::iutest::HasSubstr("0")
    ));
#else
    IUTEST_EXPECT_THAT("9347812650", ::iutest::AllOf(
          ::iutest::HasSubstr("0")
        , ::iutest::HasSubstr("1")
        , ::iutest::HasSubstr("2")
        , ::iutest::HasSubstr("3")
        , ::iutest::HasSubstr("4")
        , ::iutest::HasSubstr("5")
        , ::iutest::HasSubstr("6")
        , ::iutest::HasSubstr("7")
        , ::iutest::HasSubstr("8")
        , ::iutest::HasSubstr("9")
    ));
#endif
}